

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

void __thiscall
Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::TagT<82u,Fixpp::Type::Int>>>::
parse<Fixpp::impl::TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)78>,Fixpp::Required<Fixpp::TagT<66u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<429u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<82u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<431u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<83u,Fixpp::Type::Int>>,Fixpp::TagT<444u,Fixpp::Type::String>,Fixpp::TagT<445u,Fixpp::Type::Int>,Fixpp::TagT<446u,Fixpp::Type::Data>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::Required<Fixpp::TagT<68u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<14u,Fixpp::Type::Float>>,Fixpp::Required<Fixpp::TagT<39u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<151u,Fixpp::Type::Float>>,Fixpp::Required<Fixpp::TagT<84u,Fixpp::Type::Float>>,Fixpp::Required<Fixpp::TagT<6u,Fixpp::Type::Float>>,Fixpp::TagT<103u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>>>
          (FieldParser<Fixpp::FieldRef<Fixpp::TagT<82u,Fixpp::Type::Int>>> *this,Field *field,
          ParsingContext *context,
          TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_N_>,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<429U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<82U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<431U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<83U,_Fixpp::Type::Int>_>,_Fixpp::TagT<444U,_Fixpp::Type::String>,_Fixpp::TagT<445U,_Fixpp::Type::Int>,_Fixpp::TagT<446U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<68U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>_>_>
          *tagSet,bool param_4,bool param_5)

{
  StreamCursor *cursor_00;
  bool bVar1;
  uint tag;
  undefined1 local_70 [8];
  pair<const_char_*,_unsigned_long> view;
  Token valueToken;
  StreamCursor *cursor;
  bool param_5_local;
  bool param_4_local;
  TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_N_>,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<429U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<82U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<431U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<83U,_Fixpp::Type::Int>_>,_Fixpp::TagT<444U,_Fixpp::Type::String>,_Fixpp::TagT<445U,_Fixpp::Type::Int>,_Fixpp::TagT<446U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<68U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>_>_>
  *tagSet_local;
  ParsingContext *context_local;
  Field *field_local;
  FieldParser<Fixpp::FieldRef<Fixpp::TagT<82U,_Fixpp::Type::Int>_>_> *this_local;
  
  cursor_00 = context->cursor;
  StreamCursor::Token::Token((Token *)&view.second,context->cursor);
  bVar1 = match_until_fast('|',cursor_00);
  if (bVar1) {
    _local_70 = StreamCursor::Token::view((Token *)&view.second);
    bVar1 = StreamCursor::advance(cursor_00,1);
    if (bVar1) {
      FieldRef<Fixpp::TagT<82U,_Fixpp::Type::Int>_>::set(field,(View *)local_70);
      tag = FieldRef<Fixpp::TagT<82U,_Fixpp::Type::Int>_>::tag(field);
      TagSet<Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<429U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<82U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<431U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<83U,_Fixpp::Type::Int>_>,_Fixpp::TagT<444U,_Fixpp::Type::String>,_Fixpp::TagT<445U,_Fixpp::Type::Int>,_Fixpp::TagT<446U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<68U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>_>
      ::set(&tagSet->
             super_TagSet<Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<429U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<82U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<431U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<83U,_Fixpp::Type::Int>_>,_Fixpp::TagT<444U,_Fixpp::Type::String>,_Fixpp::TagT<445U,_Fixpp::Type::Int>,_Fixpp::TagT<446U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<68U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>_>
            ,tag);
    }
    else {
      ParsingContext::setError(context,Incomplete,"Expected value after tag \'%d\', got EOF",0x52);
    }
  }
  else {
    ParsingContext::setError(context,ParsingError,"Expected value tag \'%d\', got EOF",0x52);
  }
  return;
}

Assistant:

void parse(Field& field, ParsingContext& context, TagSet& tagSet, bool /* strict */, bool /* skipUnknown */)
            {
                auto& cursor = context.cursor;
                // @Todo: In Strict mode, validate the type of the Tag
                StreamCursor::Token valueToken(context.cursor);
                TRY_MATCH_UNTIL(SOH, "Expected value tag '%d', got EOF", TagT::Id);

                auto view = valueToken.view();
                TRY_ADVANCE("Expected value after tag '%d', got EOF", TagT::Id);

                field.set(view);
                tagSet.set(field.tag());
            }